

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderStructTests.cpp
# Opt level: O1

int __thiscall deqp::UniformStructTests::init(UniformStructTests *this,EVP_PKEY_CTX *ctx)

{
  GLSLVersion GVar1;
  Context *pCVar2;
  int extraout_EAX;
  LineStream *pLVar3;
  ShaderStructCase *pSVar4;
  undefined1 local_1d0 [384];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec3    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.x, s.b.y, s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"basic_vertex","Basic struct usage",GVar1,true,false,
                            init()::Eval_basic::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_basic::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec3    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.x, s.b.y, s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"basic_fragment","Basic struct usage",GVar1,false,false,
                            init()::Eval_basic::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_basic::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.b, s.b.a + s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_vertex","Nested struct",GVar1,true,false,
                            init()::Eval_nested::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_nested::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b.b, s.b.a + s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_fragment","Nested struct",GVar1,false,false,
                            init()::Eval_nested::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_nested::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b[0], s.b[1], s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"array_member_vertex","Struct with array member",GVar1,true,false
                            ,init()::Eval_array_member::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_array_member::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(s.a, s.b[0], s.b[1], s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"array_member_fragment","Struct with array member",GVar1,false,
                            false,init()::Eval_array_member::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_array_member::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    ${DST} = vec4(s.b[ui_one], s.b[ui_zero], s.b[ui_two], s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"array_member_dynamic_index_vertex",
                            "Struct with array member, dynamic indexing",GVar1,true,false,
                            init()::Eval_array_member_dynamic_index::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_array_member_dynamic_index::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    ${DST} = vec4(s.b[ui_one], s.b[ui_zero], s.b[ui_two], s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"array_member_dynamic_index_fragment",
                            "Struct with array member, dynamic indexing",GVar1,false,false,
                            init()::Eval_array_member_dynamic_index::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_array_member_dynamic_index::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump int     b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s[3];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    ${DST} = vec4(s[2].a, s[1].a, s[0].a, s[2].b - s[1].b + s[0].b);")
  ;
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"struct_array_vertex","Struct array",GVar1,true,false,
                            init()::Eval_struct_array::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump int     b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s[3];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    ${DST} = vec4(s[2].a, s[1].a, s[0].a, s[2].b - s[1].b + s[0].b);")
  ;
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"struct_array_fragment","Struct array",GVar1,false,false,
                            init()::Eval_struct_array::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump int     b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s[3];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    ${DST} = vec4(s[ui_two].a, s[ui_one].a, s[ui_zero].a, s[ui_two].b - s[ui_one].b + s[ui_zero].b);"
                     );
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"struct_array_dynamic_index_vertex",
                            "Struct array with dynamic indexing",GVar1,true,false,
                            init()::Eval_struct_array_dynamic_index::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_struct_array_dynamic_index::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump int     b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s[3];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    ${DST} = vec4(s[ui_two].a, s[ui_one].a, s[ui_zero].a, s[ui_two].b - s[ui_one].b + s[ui_zero].b);"
                     );
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"struct_array_dynamic_index_fragment",
                            "Struct array with dynamic indexing",GVar1,false,false,
                            init()::Eval_struct_array_dynamic_index::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_struct_array_dynamic_index::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b[2];");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s[2];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float r = (s[0].b[1].b[0].x + s[1].b[2].b[1].y) * s[0].b[0].a; // (z + z) * 0.5"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float g = s[1].b[0].b[0].y * s[0].b[2].a * s[1].b[2].a; // x * 0.25 * 4"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float b = (s[0].b[2].b[1].y + s[0].b[1].b[0].y + s[1].a) * s[0].b[1].a; // (w + w + w) * 0.333"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float a = float(s[0].c) + s[1].b[2].a - s[1].b[1].a; // 0 + 4.0 - 3.0"
                     );
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(r, g, b, a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_struct_array_vertex","Nested struct array",GVar1,true,
                            false,init()::Eval_nested_struct_array::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_nested_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b[2];");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s[2];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float r = (s[0].b[1].b[0].x + s[1].b[2].b[1].y) * s[0].b[0].a; // (z + z) * 0.5"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float g = s[1].b[0].b[0].y * s[0].b[2].a * s[1].b[2].a; // x * 0.25 * 4"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float b = (s[0].b[2].b[1].y + s[0].b[1].b[0].y + s[1].a) * s[0].b[1].a; // (w + w + w) * 0.333"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float a = float(s[0].c) + s[1].b[2].a - s[1].b[1].a; // 0 + 4.0 - 3.0"
                     );
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(r, g, b, a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_struct_array_fragment","Nested struct array",GVar1,false,
                            false,init()::Eval_nested_struct_array::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_nested_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b[2];");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s[2];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float r = (s[0].b[ui_one].b[ui_one-1].x + s[ui_one].b[ui_two].b[ui_zero+1].y) * s[0].b[0].a; // (z + z) * 0.5"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float g = s[ui_two-1].b[ui_two-2].b[ui_zero].y * s[0].b[ui_two].a * s[ui_one].b[2].a; // x * 0.25 * 4"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float b = (s[ui_zero].b[ui_one+1].b[1].y + s[0].b[ui_one*ui_one].b[0].y + s[ui_one].a) * s[0].b[ui_two-ui_one].a; // (w + w + w) * 0.333"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float a = float(s[ui_zero].c) + s[ui_one-ui_zero].b[ui_two].a - s[ui_zero+ui_one].b[ui_two-ui_one].a; // 0 + 4.0 - 3.0"
                     );
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(r, g, b, a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_struct_array_dynamic_index_vertex",
                            "Nested struct array with dynamic indexing",GVar1,true,false,
                            init()::Eval_nested_struct_array_dynamic_index::eval(deqp::
                            ShaderEvalContext__,
                            init()::SetUniforms_nested_struct_array_dynamic_index::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b[2];");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s[2];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float r = (s[0].b[ui_one].b[ui_one-1].x + s[ui_one].b[ui_two].b[ui_zero+1].y) * s[0].b[0].a; // (z + z) * 0.5"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float g = s[ui_two-1].b[ui_two-2].b[ui_zero].y * s[0].b[ui_two].a * s[ui_one].b[2].a; // x * 0.25 * 4"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float b = (s[ui_zero].b[ui_one+1].b[1].y + s[0].b[ui_one*ui_one].b[0].y + s[ui_one].a) * s[0].b[ui_two-ui_one].a; // (w + w + w) * 0.333"
                     );
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    mediump float a = float(s[ui_zero].c) + s[ui_one-ui_zero].b[ui_two].a - s[ui_zero+ui_one].b[ui_two-ui_one].a; // 0 + 4.0 - 3.0"
                     );
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(r, g, b, a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"nested_struct_array_dynamic_index_fragment",
                            "Nested struct array with dynamic indexing",GVar1,false,false,
                            init()::Eval_nested_struct_array_dynamic_index::eval(deqp::
                            ShaderEvalContext__,
                            init()::SetUniforms_nested_struct_array_dynamic_index::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump int     b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s[3];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float rgb[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int alpha = 0;");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < 3; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        rgb[i] = s[2-i].a;");
  pLVar3 = LineStream::operator<<(pLVar3,"        alpha += s[i].b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"loop_struct_array_vertex","Struct array usage in loop",GVar1,
                            true,false,
                            init()::Eval_loop_struct_array::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_loop_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump int     b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s[3];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float rgb[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int alpha = 0;");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < 3; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        rgb[i] = s[2-i].a;");
  pLVar3 = LineStream::operator<<(pLVar3,"        alpha += s[i].b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"loop_struct_array_fragment","Struct array usage in loop",GVar1,
                            false,false,
                            init()::Eval_loop_struct_array::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_loop_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_sixth;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b[2];");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s[2];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float r = 0.0; // (x*3 + y*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float g = 0.0; // (y*3 + z*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float b = 0.0; // (z*3 + w*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float a = 1.0;");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < 2; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        for (int j = 0; j < 3; j++)");
  pLVar3 = LineStream::operator<<(pLVar3,"        {");
  pLVar3 = LineStream::operator<<(pLVar3,"            r += s[0].b[j].b[i].y;");
  pLVar3 = LineStream::operator<<(pLVar3,"            g += s[i].b[j].b[0].x;");
  pLVar3 = LineStream::operator<<(pLVar3,"            b += s[i].b[j].b[1].x;");
  pLVar3 = LineStream::operator<<(pLVar3,"            a *= s[i].b[j].a;");
  pLVar3 = LineStream::operator<<(pLVar3,"        }");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    ${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"loop_nested_struct_array_vertex",
                            "Nested struct array usage in loop",GVar1,true,false,
                            init()::Eval_loop_nested_struct_array::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_loop_nested_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_sixth;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b[2];");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s[2];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float r = 0.0; // (x*3 + y*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float g = 0.0; // (y*3 + z*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float b = 0.0; // (z*3 + w*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float a = 1.0;");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < 2; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        for (int j = 0; j < 3; j++)");
  pLVar3 = LineStream::operator<<(pLVar3,"        {");
  pLVar3 = LineStream::operator<<(pLVar3,"            r += s[0].b[j].b[i].y;");
  pLVar3 = LineStream::operator<<(pLVar3,"            g += s[i].b[j].b[0].x;");
  pLVar3 = LineStream::operator<<(pLVar3,"            b += s[i].b[j].b[1].x;");
  pLVar3 = LineStream::operator<<(pLVar3,"            a *= s[i].b[j].a;");
  pLVar3 = LineStream::operator<<(pLVar3,"        }");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    ${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"loop_nested_struct_array_fragment",
                            "Nested struct array usage in loop",GVar1,false,false,
                            init()::Eval_loop_nested_struct_array::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_loop_nested_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_three;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump int     b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s[3];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float rgb[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int alpha = 0;");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < ui_three; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        rgb[i] = s[2-i].a;");
  pLVar3 = LineStream::operator<<(pLVar3,"        alpha += s[i].b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"dynamic_loop_struct_array_vertex",
                            "Struct array usage in dynamic loop",GVar1,true,false,
                            init()::Eval_dynamic_loop_struct_array::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_dynamic_loop_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_three;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump int     b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s[3];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float rgb[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int alpha = 0;");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < ui_three; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        rgb[i] = s[2-i].a;");
  pLVar3 = LineStream::operator<<(pLVar3,"        alpha += s[i].b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"dynamic_loop_struct_array_fragment",
                            "Struct array usage in dynamic loop",GVar1,false,false,
                            init()::Eval_dynamic_loop_struct_array::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_dynamic_loop_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_sixth;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b[2];");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s[2];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float r = 0.0; // (x*3 + y*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float g = 0.0; // (y*3 + z*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float b = 0.0; // (z*3 + w*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float a = 1.0;");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < ui_two; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        for (int j = 0; j < ui_three; j++)");
  pLVar3 = LineStream::operator<<(pLVar3,"        {");
  pLVar3 = LineStream::operator<<(pLVar3,"            r += s[0].b[j].b[i].y;");
  pLVar3 = LineStream::operator<<(pLVar3,"            g += s[i].b[j].b[0].x;");
  pLVar3 = LineStream::operator<<(pLVar3,"            b += s[i].b[j].b[1].x;");
  pLVar3 = LineStream::operator<<(pLVar3,"            a *= s[i].b[j].a;");
  pLVar3 = LineStream::operator<<(pLVar3,"        }");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    ${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"dynamic_loop_nested_struct_array_vertex",
                            "Nested struct array usage in dynamic loop",GVar1,true,false,
                            init()::Eval_dynamic_loop_nested_struct_array::eval(deqp::
                            ShaderEvalContext__,
                            init()::SetUniforms_dynamic_loop_nested_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform mediump float uf_sixth;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b[2];");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b[3];");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s[2];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float r = 0.0; // (x*3 + y*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float g = 0.0; // (y*3 + z*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float b = 0.0; // (z*3 + w*3) / 6.0");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float a = 1.0;");
  pLVar3 = LineStream::operator<<(pLVar3,"    for (int i = 0; i < ui_two; i++)");
  pLVar3 = LineStream::operator<<(pLVar3,"    {");
  pLVar3 = LineStream::operator<<(pLVar3,"        for (int j = 0; j < ui_three; j++)");
  pLVar3 = LineStream::operator<<(pLVar3,"        {");
  pLVar3 = LineStream::operator<<(pLVar3,"            r += s[0].b[j].b[i].y;");
  pLVar3 = LineStream::operator<<(pLVar3,"            g += s[i].b[j].b[0].x;");
  pLVar3 = LineStream::operator<<(pLVar3,"            b += s[i].b[j].b[1].x;");
  pLVar3 = LineStream::operator<<(pLVar3,"            a *= s[i].b[j].a;");
  pLVar3 = LineStream::operator<<(pLVar3,"        }");
  pLVar3 = LineStream::operator<<(pLVar3,"    }");
  pLVar3 = LineStream::operator<<
                     (pLVar3,"    ${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"dynamic_loop_nested_struct_array_fragment",
                            "Nested struct array usage in dynamic loop",GVar1,false,false,
                            init()::Eval_dynamic_loop_nested_struct_array::eval(deqp::
                            ShaderEvalContext__,
                            init()::SetUniforms_dynamic_loop_nested_struct_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec3    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    sampler2D       c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    ${DST} = vec4(texture(s.c, ${COORDS}.xy * s.b.xy + s.b.z).rgb, s.a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"sampler_vertex","Sampler in struct",GVar1,true,true,
                            init()::Eval_sampler::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_sampler::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec3    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    sampler2D       c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    ${DST} = vec4(texture(s.c, ${COORDS}.xy * s.b.xy + s.b.z).rgb, s.a);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"sampler_fragment","Sampler in struct",GVar1,false,true,
                            init()::Eval_sampler::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_sampler::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    sampler2D       a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    ${DST} = vec4(texture(s.b.a, ${COORDS}.xy * s.b.b + s.a).rgb, s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"sampler_nested_vertex","Sampler in nested struct",GVar1,true,
                            true,init()::Eval_sampler_nested::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_sampler_nested::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_zero;");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct T {");
  pLVar3 = LineStream::operator<<(pLVar3,"    sampler2D       a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec2    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    T               b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    int             c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    ${DST} = vec4(texture(s.b.a, ${COORDS}.xy * s.b.b + s.a).rgb, s.c);");
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"sampler_nested_fragment","Sampler in nested struct",GVar1,false,
                            true,init()::Eval_sampler_nested::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_sampler_nested::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec3    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    sampler2D       c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s[2];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    ${DST} = vec4(texture(s[1].c, ${COORDS}.xy * s[0].b.xy + s[1].b.z).rgb, s[0].a);"
                     );
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"sampler_array_vertex","Sampler in struct array",GVar1,true,true,
                            init()::Eval_sampler_array::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_sampler_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  pCVar2 = (this->super_TestCaseGroup).m_context;
  GVar1 = this->m_glslVersion;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1d0 + 8));
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_1d0._0_4_ = 0;
  pLVar3 = LineStream::operator<<((LineStream *)local_1d0,"${HEADER}");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform int ui_one;");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"struct S {");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump float   a;");
  pLVar3 = LineStream::operator<<(pLVar3,"    mediump vec3    b;");
  pLVar3 = LineStream::operator<<(pLVar3,"    sampler2D       c;");
  pLVar3 = LineStream::operator<<(pLVar3,"};");
  pLVar3 = LineStream::operator<<(pLVar3,"uniform S s[2];");
  pLVar3 = LineStream::operator<<(pLVar3,glcts::fixed_sample_locations_values + 1);
  pLVar3 = LineStream::operator<<(pLVar3,"void main (void)");
  pLVar3 = LineStream::operator<<(pLVar3,"{");
  pLVar3 = LineStream::operator<<
                     (pLVar3,
                      "    ${DST} = vec4(texture(s[1].c, ${COORDS}.xy * s[0].b.xy + s[1].b.z).rgb, s[0].a);"
                     );
  pLVar3 = LineStream::operator<<(pLVar3,"    ${ASSIGN_POS}");
  pLVar3 = LineStream::operator<<(pLVar3,"}");
  pSVar4 = createStructCase(pCVar2,"sampler_array_fragment","Sampler in struct array",GVar1,false,
                            true,init()::Eval_sampler_array::eval(deqp::ShaderEvalContext__,
                            init()::SetUniforms_sampler_array::setUniforms(glw::
                            Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
  LineStream::~LineStream((LineStream *)local_1d0);
  return extraout_EAX;
}

Assistant:

void UniformStructTests::init(void)
{
#define UNIFORM_STRUCT_CASE(NAME, DESCRIPTION, TEXTURES, SHADER_SRC, SET_UNIFORMS_BODY, EVAL_FUNC_BODY)      \
	do                                                                                                       \
	{                                                                                                        \
		struct SetUniforms_##NAME                                                                            \
		{                                                                                                    \
			static void setUniforms(const glw::Functions& gl, deUint32 programID,                            \
									const tcu::Vec4& constCoords) SET_UNIFORMS_BODY                          \
		};                                                                                                   \
		struct Eval_##NAME                                                                                   \
		{                                                                                                    \
			static void eval(ShaderEvalContext& c) EVAL_FUNC_BODY                                            \
		};                                                                                                   \
		addChild(createStructCase(m_context, #NAME "_vertex", DESCRIPTION, m_glslVersion, true, TEXTURES,    \
								  Eval_##NAME::eval, SetUniforms_##NAME::setUniforms, SHADER_SRC));          \
		addChild(createStructCase(m_context, #NAME "_fragment", DESCRIPTION, m_glslVersion, false, TEXTURES, \
								  Eval_##NAME::eval, SetUniforms_##NAME::setUniforms, SHADER_SRC));          \
	} while (deGetFalse())

	UNIFORM_STRUCT_CASE(basic, "Basic struct usage", false,
						LineStream() << "${HEADER}"
									 << "uniform int ui_one;"
									 << ""
									 << "struct S {"
									 << "    mediump float   a;"
									 << "    mediump vec3    b;"
									 << "    int             c;"
									 << "};"
									 << "uniform S s;"
									 << ""
									 << "void main (void)"
									 << "{"
									 << "    ${DST} = vec4(s.a, s.b.x, s.b.y, s.c);"
									 << "    ${ASSIGN_POS}"
									 << "}",
						{
							setUniform(gl, programID, "s.a", constCoords.x());
							setUniform(gl, programID, "s.b", constCoords.swizzle(1, 2, 3));
							setUniform(gl, programID, "s.c", 1);
						},
						{ c.color.xyz() = c.constCoords.swizzle(0, 1, 2); });

	UNIFORM_STRUCT_CASE(nested, "Nested struct", false,
						LineStream() << "${HEADER}"
									 << "uniform int ui_zero;"
									 << "uniform int ui_one;"
									 << ""
									 << "struct T {"
									 << "    int             a;"
									 << "    mediump vec2    b;"
									 << "};"
									 << "struct S {"
									 << "    mediump float   a;"
									 << "    T               b;"
									 << "    int             c;"
									 << "};"
									 << "uniform S s;"
									 << ""
									 << "void main (void)"
									 << "{"
									 << "    ${DST} = vec4(s.a, s.b.b, s.b.a + s.c);"
									 << "    ${ASSIGN_POS}"
									 << "}",
						{
							setUniform(gl, programID, "s.a", constCoords.x());
							setUniform(gl, programID, "s.b.a", 0);
							setUniform(gl, programID, "s.b.b", constCoords.swizzle(1, 2));
							setUniform(gl, programID, "s.c", 1);
						},
						{ c.color.xyz() = c.constCoords.swizzle(0, 1, 2); });

	UNIFORM_STRUCT_CASE(array_member, "Struct with array member", false,
						LineStream() << "${HEADER}"
									 << "uniform int ui_one;"
									 << ""
									 << "struct S {"
									 << "    mediump float   a;"
									 << "    mediump float   b[3];"
									 << "    int             c;"
									 << "};"
									 << "uniform S s;"
									 << ""
									 << "void main (void)"
									 << "{"
									 << "    ${DST} = vec4(s.a, s.b[0], s.b[1], s.c);"
									 << "    ${ASSIGN_POS}"
									 << "}",
						{
							setUniform(gl, programID, "s.a", constCoords.w());
							setUniform(gl, programID, "s.c", 1);

							float b[3];
							b[0] = constCoords.z();
							b[1] = constCoords.y();
							b[2] = constCoords.x();
							setUniform(gl, programID, "s.b", b, DE_LENGTH_OF_ARRAY(b));
						},
						{ c.color.xyz() = c.constCoords.swizzle(3, 2, 1); });

	UNIFORM_STRUCT_CASE(array_member_dynamic_index, "Struct with array member, dynamic indexing", false,
						LineStream() << "${HEADER}"
									 << "uniform int ui_zero;"
									 << "uniform int ui_one;"
									 << "uniform int ui_two;"
									 << ""
									 << "struct S {"
									 << "    mediump float   a;"
									 << "    mediump float   b[3];"
									 << "    int             c;"
									 << "};"
									 << "uniform S s;"
									 << ""
									 << "void main (void)"
									 << "{"
									 << "    ${DST} = vec4(s.b[ui_one], s.b[ui_zero], s.b[ui_two], s.c);"
									 << "    ${ASSIGN_POS}"
									 << "}",
						{
							setUniform(gl, programID, "s.a", constCoords.w());
							setUniform(gl, programID, "s.c", 1);

							float b[3];
							b[0] = constCoords.z();
							b[1] = constCoords.y();
							b[2] = constCoords.x();
							setUniform(gl, programID, "s.b", b, DE_LENGTH_OF_ARRAY(b));
						},
						{ c.color.xyz() = c.constCoords.swizzle(1, 2, 0); });

	UNIFORM_STRUCT_CASE(struct_array, "Struct array", false,
						LineStream() << "${HEADER}"
									 << "uniform int ui_zero;"
									 << "uniform int ui_one;"
									 << "uniform int ui_two;"
									 << ""
									 << "struct S {"
									 << "    mediump float   a;"
									 << "    mediump int     b;"
									 << "};"
									 << "uniform S s[3];"
									 << ""
									 << "void main (void)"
									 << "{"
									 << "    ${DST} = vec4(s[2].a, s[1].a, s[0].a, s[2].b - s[1].b + s[0].b);"
									 << "    ${ASSIGN_POS}"
									 << "}",
						{
							setUniform(gl, programID, "s[0].a", constCoords.x());
							setUniform(gl, programID, "s[0].b", 0);
							setUniform(gl, programID, "s[1].a", constCoords.y());
							setUniform(gl, programID, "s[1].b", 1);
							setUniform(gl, programID, "s[2].a", constCoords.z());
							setUniform(gl, programID, "s[2].b", 2);
						},
						{ c.color.xyz() = c.constCoords.swizzle(2, 1, 0); });

	UNIFORM_STRUCT_CASE(
		struct_array_dynamic_index, "Struct array with dynamic indexing", false,
		LineStream()
			<< "${HEADER}"
			<< "uniform int ui_zero;"
			<< "uniform int ui_one;"
			<< "uniform int ui_two;"
			<< ""
			<< "struct S {"
			<< "    mediump float   a;"
			<< "    mediump int     b;"
			<< "};"
			<< "uniform S s[3];"
			<< ""
			<< "void main (void)"
			<< "{"
			<< "    ${DST} = vec4(s[ui_two].a, s[ui_one].a, s[ui_zero].a, s[ui_two].b - s[ui_one].b + s[ui_zero].b);"
			<< "    ${ASSIGN_POS}"
			<< "}",
		{
			setUniform(gl, programID, "s[0].a", constCoords.x());
			setUniform(gl, programID, "s[0].b", 0);
			setUniform(gl, programID, "s[1].a", constCoords.y());
			setUniform(gl, programID, "s[1].b", 1);
			setUniform(gl, programID, "s[2].a", constCoords.z());
			setUniform(gl, programID, "s[2].b", 2);
		},
		{ c.color.xyz() = c.constCoords.swizzle(2, 1, 0); });

	UNIFORM_STRUCT_CASE(
		nested_struct_array, "Nested struct array", false,
		LineStream() << "${HEADER}"
					 << "struct T {"
					 << "    mediump float   a;"
					 << "    mediump vec2    b[2];"
					 << "};"
					 << "struct S {"
					 << "    mediump float   a;"
					 << "    T               b[3];"
					 << "    int             c;"
					 << "};"
					 << "uniform S s[2];"
					 << ""
					 << "void main (void)"
					 << "{"
					 << "    mediump float r = (s[0].b[1].b[0].x + s[1].b[2].b[1].y) * s[0].b[0].a; // (z + z) * 0.5"
					 << "    mediump float g = s[1].b[0].b[0].y * s[0].b[2].a * s[1].b[2].a; // x * 0.25 * 4"
					 << "    mediump float b = (s[0].b[2].b[1].y + s[0].b[1].b[0].y + s[1].a) * s[0].b[1].a; // (w + w "
						"+ w) * 0.333"
					 << "    mediump float a = float(s[0].c) + s[1].b[2].a - s[1].b[1].a; // 0 + 4.0 - 3.0"
					 << "    ${DST} = vec4(r, g, b, a);"
					 << "    ${ASSIGN_POS}"
					 << "}",
		{
			tcu::Vec2 arr[2];

			setUniform(gl, programID, "s[0].a", constCoords.x());
			arr[0] = constCoords.swizzle(0, 1);
			arr[1] = constCoords.swizzle(2, 3);
			setUniform(gl, programID, "s[0].b[0].a", 0.5f);
			setUniform(gl, programID, "s[0].b[0].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
			arr[0] = constCoords.swizzle(2, 3);
			arr[1] = constCoords.swizzle(0, 1);
			setUniform(gl, programID, "s[0].b[1].a", 1.0f / 3.0f);
			setUniform(gl, programID, "s[0].b[1].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
			arr[0] = constCoords.swizzle(0, 2);
			arr[1] = constCoords.swizzle(1, 3);
			setUniform(gl, programID, "s[0].b[2].a", 1.0f / 4.0f);
			setUniform(gl, programID, "s[0].b[2].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
			setUniform(gl, programID, "s[0].c", 0);

			setUniform(gl, programID, "s[1].a", constCoords.w());
			arr[0] = constCoords.swizzle(0, 0);
			arr[1] = constCoords.swizzle(1, 1);
			setUniform(gl, programID, "s[1].b[0].a", 2.0f);
			setUniform(gl, programID, "s[1].b[0].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
			arr[0] = constCoords.swizzle(2, 2);
			arr[1] = constCoords.swizzle(3, 3);
			setUniform(gl, programID, "s[1].b[1].a", 3.0f);
			setUniform(gl, programID, "s[1].b[1].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
			arr[0] = constCoords.swizzle(1, 0);
			arr[1] = constCoords.swizzle(3, 2);
			setUniform(gl, programID, "s[1].b[2].a", 4.0f);
			setUniform(gl, programID, "s[1].b[2].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
			setUniform(gl, programID, "s[1].c", 1);
		},
		{ c.color.xyz() = c.constCoords.swizzle(2, 0, 3); });

	UNIFORM_STRUCT_CASE(nested_struct_array_dynamic_index, "Nested struct array with dynamic indexing", false,
						LineStream() << "${HEADER}"
									 << "uniform int ui_zero;"
									 << "uniform int ui_one;"
									 << "uniform int ui_two;"
									 << ""
									 << "struct T {"
									 << "    mediump float   a;"
									 << "    mediump vec2    b[2];"
									 << "};"
									 << "struct S {"
									 << "    mediump float   a;"
									 << "    T               b[3];"
									 << "    int             c;"
									 << "};"
									 << "uniform S s[2];"
									 << ""
									 << "void main (void)"
									 << "{"
									 << "    mediump float r = (s[0].b[ui_one].b[ui_one-1].x + "
										"s[ui_one].b[ui_two].b[ui_zero+1].y) * s[0].b[0].a; // (z + z) * 0.5"
									 << "    mediump float g = s[ui_two-1].b[ui_two-2].b[ui_zero].y * s[0].b[ui_two].a "
										"* s[ui_one].b[2].a; // x * 0.25 * 4"
									 << "    mediump float b = (s[ui_zero].b[ui_one+1].b[1].y + "
										"s[0].b[ui_one*ui_one].b[0].y + s[ui_one].a) * s[0].b[ui_two-ui_one].a; // (w "
										"+ w + w) * 0.333"
									 << "    mediump float a = float(s[ui_zero].c) + s[ui_one-ui_zero].b[ui_two].a - "
										"s[ui_zero+ui_one].b[ui_two-ui_one].a; // 0 + 4.0 - 3.0"
									 << "    ${DST} = vec4(r, g, b, a);"
									 << "    ${ASSIGN_POS}"
									 << "}",
						{
							tcu::Vec2 arr[2];

							setUniform(gl, programID, "s[0].a", constCoords.x());
							arr[0] = constCoords.swizzle(0, 1);
							arr[1] = constCoords.swizzle(2, 3);
							setUniform(gl, programID, "s[0].b[0].a", 0.5f);
							setUniform(gl, programID, "s[0].b[0].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
							arr[0] = constCoords.swizzle(2, 3);
							arr[1] = constCoords.swizzle(0, 1);
							setUniform(gl, programID, "s[0].b[1].a", 1.0f / 3.0f);
							setUniform(gl, programID, "s[0].b[1].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
							arr[0] = constCoords.swizzle(0, 2);
							arr[1] = constCoords.swizzle(1, 3);
							setUniform(gl, programID, "s[0].b[2].a", 1.0f / 4.0f);
							setUniform(gl, programID, "s[0].b[2].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
							setUniform(gl, programID, "s[0].c", 0);

							setUniform(gl, programID, "s[1].a", constCoords.w());
							arr[0] = constCoords.swizzle(0, 0);
							arr[1] = constCoords.swizzle(1, 1);
							setUniform(gl, programID, "s[1].b[0].a", 2.0f);
							setUniform(gl, programID, "s[1].b[0].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
							arr[0] = constCoords.swizzle(2, 2);
							arr[1] = constCoords.swizzle(3, 3);
							setUniform(gl, programID, "s[1].b[1].a", 3.0f);
							setUniform(gl, programID, "s[1].b[1].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
							arr[0] = constCoords.swizzle(1, 0);
							arr[1] = constCoords.swizzle(3, 2);
							setUniform(gl, programID, "s[1].b[2].a", 4.0f);
							setUniform(gl, programID, "s[1].b[2].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
							setUniform(gl, programID, "s[1].c", 1);
						},
						{ c.color.xyz() = c.constCoords.swizzle(2, 0, 3); });

	UNIFORM_STRUCT_CASE(loop_struct_array, "Struct array usage in loop", false,
						LineStream() << "${HEADER}"
									 << "uniform int ui_zero;"
									 << "uniform int ui_one;"
									 << "uniform int ui_two;"
									 << ""
									 << "struct S {"
									 << "    mediump float   a;"
									 << "    mediump int     b;"
									 << "};"
									 << "uniform S s[3];"
									 << ""
									 << "void main (void)"
									 << "{"
									 << "    mediump float rgb[3];"
									 << "    int alpha = 0;"
									 << "    for (int i = 0; i < 3; i++)"
									 << "    {"
									 << "        rgb[i] = s[2-i].a;"
									 << "        alpha += s[i].b;"
									 << "    }"
									 << "    ${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);"
									 << "    ${ASSIGN_POS}"
									 << "}",
						{
							setUniform(gl, programID, "s[0].a", constCoords.x());
							setUniform(gl, programID, "s[0].b", 0);
							setUniform(gl, programID, "s[1].a", constCoords.y());
							setUniform(gl, programID, "s[1].b", -1);
							setUniform(gl, programID, "s[2].a", constCoords.z());
							setUniform(gl, programID, "s[2].b", 2);
						},
						{ c.color.xyz() = c.constCoords.swizzle(2, 1, 0); });

	UNIFORM_STRUCT_CASE(loop_nested_struct_array, "Nested struct array usage in loop", false,
						LineStream() << "${HEADER}"
									 << "uniform int ui_zero;"
									 << "uniform int ui_one;"
									 << "uniform int ui_two;"
									 << "uniform mediump float uf_two;"
									 << "uniform mediump float uf_three;"
									 << "uniform mediump float uf_four;"
									 << "uniform mediump float uf_half;"
									 << "uniform mediump float uf_third;"
									 << "uniform mediump float uf_fourth;"
									 << "uniform mediump float uf_sixth;"
									 << ""
									 << "struct T {"
									 << "    mediump float   a;"
									 << "    mediump vec2    b[2];"
									 << "};"
									 << "struct S {"
									 << "    mediump float   a;"
									 << "    T               b[3];"
									 << "    int             c;"
									 << "};"
									 << "uniform S s[2];"
									 << ""
									 << "void main (void)"
									 << "{"
									 << "    mediump float r = 0.0; // (x*3 + y*3) / 6.0"
									 << "    mediump float g = 0.0; // (y*3 + z*3) / 6.0"
									 << "    mediump float b = 0.0; // (z*3 + w*3) / 6.0"
									 << "    mediump float a = 1.0;"
									 << "    for (int i = 0; i < 2; i++)"
									 << "    {"
									 << "        for (int j = 0; j < 3; j++)"
									 << "        {"
									 << "            r += s[0].b[j].b[i].y;"
									 << "            g += s[i].b[j].b[0].x;"
									 << "            b += s[i].b[j].b[1].x;"
									 << "            a *= s[i].b[j].a;"
									 << "        }"
									 << "    }"
									 << "    ${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);"
									 << "    ${ASSIGN_POS}"
									 << "}",
						{
							tcu::Vec2 arr[2];

							setUniform(gl, programID, "s[0].a", constCoords.x());
							arr[0] = constCoords.swizzle(1, 0);
							arr[1] = constCoords.swizzle(2, 0);
							setUniform(gl, programID, "s[0].b[0].a", 0.5f);
							setUniform(gl, programID, "s[0].b[0].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
							arr[0] = constCoords.swizzle(1, 1);
							arr[1] = constCoords.swizzle(3, 1);
							setUniform(gl, programID, "s[0].b[1].a", 1.0f / 3.0f);
							setUniform(gl, programID, "s[0].b[1].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
							arr[0] = constCoords.swizzle(2, 1);
							arr[1] = constCoords.swizzle(2, 1);
							setUniform(gl, programID, "s[0].b[2].a", 1.0f / 4.0f);
							setUniform(gl, programID, "s[0].b[2].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
							setUniform(gl, programID, "s[0].c", 0);

							setUniform(gl, programID, "s[1].a", constCoords.w());
							arr[0] = constCoords.swizzle(2, 0);
							arr[1] = constCoords.swizzle(2, 1);
							setUniform(gl, programID, "s[1].b[0].a", 2.0f);
							setUniform(gl, programID, "s[1].b[0].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
							arr[0] = constCoords.swizzle(2, 2);
							arr[1] = constCoords.swizzle(3, 3);
							setUniform(gl, programID, "s[1].b[1].a", 3.0f);
							setUniform(gl, programID, "s[1].b[1].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
							arr[0] = constCoords.swizzle(1, 0);
							arr[1] = constCoords.swizzle(3, 2);
							setUniform(gl, programID, "s[1].b[2].a", 4.0f);
							setUniform(gl, programID, "s[1].b[2].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
							setUniform(gl, programID, "s[1].c", 1);
						},
						{ c.color.xyz() = (c.constCoords.swizzle(0, 1, 2) + c.constCoords.swizzle(1, 2, 3)) * 0.5f; });

	UNIFORM_STRUCT_CASE(dynamic_loop_struct_array, "Struct array usage in dynamic loop", false,
						LineStream() << "${HEADER}"
									 << "uniform int ui_zero;"
									 << "uniform int ui_one;"
									 << "uniform int ui_two;"
									 << "uniform int ui_three;"
									 << ""
									 << "struct S {"
									 << "    mediump float   a;"
									 << "    mediump int     b;"
									 << "};"
									 << "uniform S s[3];"
									 << ""
									 << "void main (void)"
									 << "{"
									 << "    mediump float rgb[3];"
									 << "    int alpha = 0;"
									 << "    for (int i = 0; i < ui_three; i++)"
									 << "    {"
									 << "        rgb[i] = s[2-i].a;"
									 << "        alpha += s[i].b;"
									 << "    }"
									 << "    ${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);"
									 << "    ${ASSIGN_POS}"
									 << "}",
						{
							setUniform(gl, programID, "s[0].a", constCoords.x());
							setUniform(gl, programID, "s[0].b", 0);
							setUniform(gl, programID, "s[1].a", constCoords.y());
							setUniform(gl, programID, "s[1].b", -1);
							setUniform(gl, programID, "s[2].a", constCoords.z());
							setUniform(gl, programID, "s[2].b", 2);
						},
						{ c.color.xyz() = c.constCoords.swizzle(2, 1, 0); });

	UNIFORM_STRUCT_CASE(dynamic_loop_nested_struct_array, "Nested struct array usage in dynamic loop", false,
						LineStream() << "${HEADER}"
									 << "uniform int ui_zero;"
									 << "uniform int ui_one;"
									 << "uniform int ui_two;"
									 << "uniform int ui_three;"
									 << "uniform mediump float uf_two;"
									 << "uniform mediump float uf_three;"
									 << "uniform mediump float uf_four;"
									 << "uniform mediump float uf_half;"
									 << "uniform mediump float uf_third;"
									 << "uniform mediump float uf_fourth;"
									 << "uniform mediump float uf_sixth;"
									 << ""
									 << "struct T {"
									 << "    mediump float   a;"
									 << "    mediump vec2    b[2];"
									 << "};"
									 << "struct S {"
									 << "    mediump float   a;"
									 << "    T               b[3];"
									 << "    int             c;"
									 << "};"
									 << "uniform S s[2];"
									 << ""
									 << "void main (void)"
									 << "{"
									 << "    mediump float r = 0.0; // (x*3 + y*3) / 6.0"
									 << "    mediump float g = 0.0; // (y*3 + z*3) / 6.0"
									 << "    mediump float b = 0.0; // (z*3 + w*3) / 6.0"
									 << "    mediump float a = 1.0;"
									 << "    for (int i = 0; i < ui_two; i++)"
									 << "    {"
									 << "        for (int j = 0; j < ui_three; j++)"
									 << "        {"
									 << "            r += s[0].b[j].b[i].y;"
									 << "            g += s[i].b[j].b[0].x;"
									 << "            b += s[i].b[j].b[1].x;"
									 << "            a *= s[i].b[j].a;"
									 << "        }"
									 << "    }"
									 << "    ${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);"
									 << "    ${ASSIGN_POS}"
									 << "}",
						{
							tcu::Vec2 arr[2];

							setUniform(gl, programID, "s[0].a", constCoords.x());
							arr[0] = constCoords.swizzle(1, 0);
							arr[1] = constCoords.swizzle(2, 0);
							setUniform(gl, programID, "s[0].b[0].a", 0.5f);
							setUniform(gl, programID, "s[0].b[0].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
							arr[0] = constCoords.swizzle(1, 1);
							arr[1] = constCoords.swizzle(3, 1);
							setUniform(gl, programID, "s[0].b[1].a", 1.0f / 3.0f);
							setUniform(gl, programID, "s[0].b[1].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
							arr[0] = constCoords.swizzle(2, 1);
							arr[1] = constCoords.swizzle(2, 1);
							setUniform(gl, programID, "s[0].b[2].a", 1.0f / 4.0f);
							setUniform(gl, programID, "s[0].b[2].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
							setUniform(gl, programID, "s[0].c", 0);

							setUniform(gl, programID, "s[1].a", constCoords.w());
							arr[0] = constCoords.swizzle(2, 0);
							arr[1] = constCoords.swizzle(2, 1);
							setUniform(gl, programID, "s[1].b[0].a", 2.0f);
							setUniform(gl, programID, "s[1].b[0].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
							arr[0] = constCoords.swizzle(2, 2);
							arr[1] = constCoords.swizzle(3, 3);
							setUniform(gl, programID, "s[1].b[1].a", 3.0f);
							setUniform(gl, programID, "s[1].b[1].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
							arr[0] = constCoords.swizzle(1, 0);
							arr[1] = constCoords.swizzle(3, 2);
							setUniform(gl, programID, "s[1].b[2].a", 4.0f);
							setUniform(gl, programID, "s[1].b[2].b", &arr[0], DE_LENGTH_OF_ARRAY(arr));
							setUniform(gl, programID, "s[1].c", 1);
						},
						{ c.color.xyz() = (c.constCoords.swizzle(0, 1, 2) + c.constCoords.swizzle(1, 2, 3)) * 0.5f; });

	UNIFORM_STRUCT_CASE(
		sampler, "Sampler in struct", true,
		LineStream() << "${HEADER}"
					 << "uniform int ui_one;"
					 << ""
					 << "struct S {"
					 << "    mediump float   a;"
					 << "    mediump vec3    b;"
					 << "    sampler2D       c;"
					 << "};"
					 << "uniform S s;"
					 << ""
					 << "void main (void)"
					 << "{"
					 << "    ${DST} = vec4(texture(s.c, ${COORDS}.xy * s.b.xy + s.b.z).rgb, s.a);"
					 << "    ${ASSIGN_POS}"
					 << "}",
		{
			DE_UNREF(constCoords);
			setUniform(gl, programID, "s.a", 1.0f);
			setUniform(gl, programID, "s.b", tcu::Vec3(0.75f, 0.75f, 0.1f));
			setUniform(gl, programID, "s.c", TEXTURE_GRADIENT);
		},
		{ c.color.xyz() = c.texture2D(TEXTURE_GRADIENT, c.coords.swizzle(0, 1) * 0.75f + 0.1f).swizzle(0, 1, 2); });

	UNIFORM_STRUCT_CASE(
		sampler_nested, "Sampler in nested struct", true,
		LineStream() << "${HEADER}"
					 << "uniform int ui_zero;"
					 << "uniform int ui_one;"
					 << ""
					 << "struct T {"
					 << "    sampler2D       a;"
					 << "    mediump vec2    b;"
					 << "};"
					 << "struct S {"
					 << "    mediump float   a;"
					 << "    T               b;"
					 << "    int             c;"
					 << "};"
					 << "uniform S s;"
					 << ""
					 << "void main (void)"
					 << "{"
					 << "    ${DST} = vec4(texture(s.b.a, ${COORDS}.xy * s.b.b + s.a).rgb, s.c);"
					 << "    ${ASSIGN_POS}"
					 << "}",
		{
			DE_UNREF(constCoords);
			setUniform(gl, programID, "s.a", 0.1f);
			setUniform(gl, programID, "s.b.a", TEXTURE_GRADIENT);
			setUniform(gl, programID, "s.b.b", tcu::Vec2(0.75f, 0.75f));
			setUniform(gl, programID, "s.c", 1);
		},
		{ c.color.xyz() = c.texture2D(TEXTURE_GRADIENT, c.coords.swizzle(0, 1) * 0.75f + 0.1f).swizzle(0, 1, 2); });

	UNIFORM_STRUCT_CASE(
		sampler_array, "Sampler in struct array", true,
		LineStream() << "${HEADER}"
					 << "uniform int ui_one;"
					 << ""
					 << "struct S {"
					 << "    mediump float   a;"
					 << "    mediump vec3    b;"
					 << "    sampler2D       c;"
					 << "};"
					 << "uniform S s[2];"
					 << ""
					 << "void main (void)"
					 << "{"
					 << "    ${DST} = vec4(texture(s[1].c, ${COORDS}.xy * s[0].b.xy + s[1].b.z).rgb, s[0].a);"
					 << "    ${ASSIGN_POS}"
					 << "}",
		{
			DE_UNREF(constCoords);
			setUniform(gl, programID, "s[0].a", 1.0f);
			setUniform(gl, programID, "s[0].b", tcu::Vec3(0.75f, 0.75f, 0.25f));
			setUniform(gl, programID, "s[0].c", 1);
			setUniform(gl, programID, "s[1].a", 0.0f);
			setUniform(gl, programID, "s[1].b", tcu::Vec3(0.5f, 0.5f, 0.1f));
			setUniform(gl, programID, "s[1].c", TEXTURE_GRADIENT);
		},
		{ c.color.xyz() = c.texture2D(TEXTURE_GRADIENT, c.coords.swizzle(0, 1) * 0.75f + 0.1f).swizzle(0, 1, 2); });
}